

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

QKeySequence __thiscall QAction::shortcut(QAction *this)

{
  long in_RSI;
  
  if (*(long *)(*(long *)(in_RSI + 8) + 0x118) == 0) {
    QKeySequence::QKeySequence((QKeySequence *)this);
  }
  else {
    QKeySequence::QKeySequence
              ((QKeySequence *)this,*(QKeySequence **)(*(long *)(in_RSI + 8) + 0x110));
  }
  return (QKeySequence)(QKeySequencePrivate *)this;
}

Assistant:

QKeySequence QAction::shortcut() const
{
    Q_D(const QAction);
    if (d->shortcuts.isEmpty())
        return QKeySequence();
    return d->shortcuts.first();
}